

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::resume_state_machine_execution(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  nuraft_global_mgr *this_00;
  char *pcVar3;
  char *pcVar4;
  unique_lock<std::mutex> l;
  ptr<raft_server> pStack_48;
  undefined1 local_38 [16];
  char local_28 [16];
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar4 = "ACTIVE";
      if (((this->sm_commit_paused_)._M_base._M_i & 1U) != 0) {
        pcVar4 = "PAUSED";
      }
      pcVar3 = "SLEEPING";
      if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
        pcVar3 = "RUNNING";
      }
      msg_if_given_abi_cxx11_
                ((string *)local_38,
                 "resume state machine execution, previously %s, state machine %s",pcVar4,pcVar3);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"resume_state_machine_execution",0x386,(string *)local_38);
      if ((char *)local_38._0_8_ != local_28) {
        operator_delete((void *)local_38._0_8_);
      }
    }
  }
  LOCK();
  (this->sm_commit_paused_)._M_base._M_i = false;
  UNLOCK();
  this_00 = nuraft_global_mgr::get_instance();
  if (this_00 == (nuraft_global_mgr *)0x0) {
    local_38._0_8_ = &this->commit_cv_lock_;
    local_38[8] = false;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_38);
    local_38[8] = true;
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  }
  else {
    std::__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nuraft::raft_server,void>
              ((__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2> *)&pStack_48,
               (__weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<nuraft::raft_server>);
    nuraft_global_mgr::request_commit(this_00,&pStack_48);
    if (pStack_48.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (pStack_48.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void raft_server::resume_state_machine_execution() {
    p_in( "resume state machine execution, previously %s, state machine %s",
          sm_commit_paused_ ? "PAUSED" : "ACTIVE",
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING" );
    sm_commit_paused_ = false;

    nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
    if (mgr) {
        // Global mgr.
        mgr->request_commit( this->shared_from_this() );
    } else {
        // Local commit thread.
        std::unique_lock<std::mutex> l(commit_cv_lock_);
        commit_cv_.notify_one();
    }
}